

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slgh_compile.cc
# Opt level: O0

bool __thiscall
ConsistencyChecker::checkOpMisuse(ConsistencyChecker *this,OpTpl *op,Constructor *ct)

{
  SleighCompile *this_00;
  bool bVar1;
  OpCode OVar2;
  ulong uVar3;
  ConstTpl *this_01;
  Location *loc;
  allocator local_49;
  string local_48 [32];
  VarnodeTpl *local_28;
  VarnodeTpl *vn;
  Constructor *ct_local;
  OpTpl *op_local;
  ConsistencyChecker *this_local;
  
  vn = (VarnodeTpl *)ct;
  ct_local = (Constructor *)op;
  op_local = (OpTpl *)this;
  OVar2 = OpTpl::getOpcode(op);
  if (OVar2 == CPUI_INT_LESS) {
    local_28 = OpTpl::getIn((OpTpl *)ct_local,1);
    VarnodeTpl::getSpace(local_28);
    uVar3 = ConstTpl::isConstSpace();
    if ((uVar3 & 1) != 0) {
      this_01 = VarnodeTpl::getOffset(local_28);
      bVar1 = ConstTpl::isZero(this_01);
      if (bVar1) {
        this_00 = this->compiler;
        loc = SleighCompile::getLocation(this_00,(Constructor *)vn);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_48,"Unsigned comparison with zero is always false",&local_49);
        SleighCompile::reportWarning(this_00,loc,(string *)local_48);
        std::__cxx11::string::~string(local_48);
        std::allocator<char>::~allocator((allocator<char> *)&local_49);
      }
    }
  }
  return true;
}

Assistant:

bool ConsistencyChecker::checkOpMisuse(OpTpl *op,Constructor *ct)

{
  switch(op->getOpcode()) {
  case CPUI_INT_LESS:
    {
      VarnodeTpl *vn = op->getIn(1);
      if (vn->getSpace().isConstSpace() && vn->getOffset().isZero()) {
	compiler->reportWarning(compiler->getLocation(ct), "Unsigned comparison with zero is always false");
      }
    }
    break;
  default:
    break;
  }
  return true;
}